

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3RealSameAsInt(double r1,sqlite3_int64 i)

{
  uint uVar1;
  
  if ((r1 == 0.0) && (!NAN(r1))) {
    return 1;
  }
  uVar1 = 0;
  if ((-0x8000000000001 < i) && (r1 == (double)i)) {
    uVar1 = (uint)(i < 0x8000000000000);
  }
  return uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3RealSameAsInt(double r1, sqlite3_int64 i){
  double r2 = (double)i;
  return r1==0.0
      || (memcmp(&r1, &r2, sizeof(r1))==0
          && i >= -2251799813685248LL && i < 2251799813685248LL);
}